

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O3

pair<llvm::StringRef,_llvm::StringRef> *
llvm::format_provider<llvm::iterator_range<llvm::StringRef_*>,_void>::parseOptions
          (pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef Style)

{
  undefined1 auVar1 [16];
  ulong in_R8;
  StringRef SVar2;
  StringRef SVar3;
  char *local_38;
  StringRef Style_local;
  
  Style_local.Data = (char *)Style.Length;
  local_38 = Style.Data;
  SVar2.Length = in_R8;
  SVar2.Data = (char *)0x2;
  SVar2 = consumeOneOption((format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *)
                           &local_38,(StringRef *)0x24,-0x39,SVar2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8;
  SVar3 = consumeOneOption((format_provider<llvm::iterator_range<llvm::StringRef_*>,_void> *)
                           &local_38,(StringRef *)0x40,'\x1c',(StringRef)(auVar1 << 0x40));
  if (Style_local.Data == (char *)0x0) {
    __return_storage_ptr__->first = SVar2;
    __return_storage_ptr__->second = SVar3;
    return __return_storage_ptr__;
  }
  __assert_fail("Style.empty() && \"Unexpected text in range option string!\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                ,0x187,
                "static std::pair<StringRef, StringRef> llvm::format_provider<llvm::iterator_range<llvm::StringRef *>>::parseOptions(StringRef) [T = llvm::iterator_range<llvm::StringRef *>, Enable = void]"
               );
}

Assistant:

static std::pair<StringRef, StringRef> parseOptions(StringRef Style) {
    StringRef Sep = consumeOneOption(Style, '$', ", ");
    StringRef Args = consumeOneOption(Style, '@', "");
    assert(Style.empty() && "Unexpected text in range option string!");
    return std::make_pair(Sep, Args);
  }